

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t generic_unpack(exr_decode_pipeline_t *decode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint16_t uVar9;
  float fVar10;
  uint32_t ui;
  long lVar11;
  long lVar12;
  long in_RDI;
  int s_8;
  uint32_t *src_8;
  uint32_t fint_3;
  int s_7;
  uint32_t *src_7;
  uint32_t fint_2;
  int s_6;
  uint32_t *src_6;
  uint32_t fint_1;
  int s_5;
  uint32_t *src_5;
  int s_4;
  uint32_t *src_4;
  uint32_t fint;
  int s_3;
  uint32_t *src_3;
  uint16_t cval_1;
  int s_2;
  uint16_t *src_2;
  uint16_t cval;
  int s_1;
  uint16_t *src_1;
  int s;
  uint16_t *src;
  exr_coding_channel_info_t *decc;
  int c;
  int cury;
  int y;
  int uls;
  int ubpc;
  int bpc;
  int h;
  int w;
  uint8_t *cdata;
  uint8_t *srcbuffer;
  uint in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  int local_d4;
  int local_c4;
  int local_b4;
  int local_a4;
  int local_94;
  int local_84;
  int local_74;
  int local_64;
  int local_54;
  int local_40;
  int local_38;
  float *local_20;
  
  iVar2 = *(int *)(in_RDI + 0x60);
  iVar3 = *(int *)(in_RDI + 0x2c);
  iVar4 = *(int *)(in_RDI + 100);
  local_38 = 0;
  do {
    if (iVar3 - iVar4 <= local_38) {
      return 0;
    }
    iVar5 = *(int *)(in_RDI + 0x28);
    for (local_40 = 0; local_40 < *(short *)(in_RDI + 0x10); local_40 = local_40 + 1) {
      lVar11 = *(long *)(in_RDI + 8) + (long)local_40 * 0x30;
      lVar8 = *(long *)(lVar11 + 0x28);
      iVar6 = *(int *)(lVar11 + 0xc);
      iVar7 = *(int *)(lVar11 + 0x20);
      if (*(int *)(lVar11 + 0x14) < 2) {
        if ((iVar2 <= local_38) && (lVar8 != 0)) {
          lVar12 = (long)(local_38 - iVar2) * (long)*(int *)(lVar11 + 0x24);
          goto LAB_0015a36d;
        }
      }
      else if ((((local_38 + iVar5) % *(int *)(lVar11 + 0x14) == 0) && (iVar2 <= local_38)) &&
              (lVar8 != 0)) {
        lVar12 = (long)((local_38 - iVar2) / *(int *)(lVar11 + 0x14)) *
                 (long)*(int *)(lVar11 + 0x24);
LAB_0015a36d:
        local_20 = (float *)(lVar12 + lVar8);
        sVar1 = *(short *)(lVar11 + 0x1a);
        if (sVar1 == 0) {
          sVar1 = *(short *)(lVar11 + 0x1e);
          if (sVar1 == 0) {
            for (local_d4 = 0; local_d4 < iVar6; local_d4 = local_d4 + 1) {
              fVar10 = (float)unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,
                                                                in_stack_ffffffffffffff20));
              *local_20 = fVar10;
              local_20 = (float *)((long)local_20 + (long)iVar7);
            }
          }
          else if (sVar1 == 1) {
            for (local_b4 = 0; local_b4 < iVar6; local_b4 = local_b4 + 1) {
              unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
              uVar9 = uint_to_half(0x15a7e7);
              *(uint16_t *)local_20 = uVar9;
              local_20 = (float *)((long)local_20 + (long)iVar7);
            }
          }
          else {
            if (sVar1 != 2) {
              return 3;
            }
            for (local_c4 = 0; local_c4 < iVar6; local_c4 = local_c4 + 1) {
              ui = unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,
                                                     in_stack_ffffffffffffff20));
              fVar10 = uint_to_float(ui);
              *local_20 = fVar10;
              local_20 = (float *)((long)local_20 + (long)iVar7);
            }
          }
        }
        else if (sVar1 == 1) {
          in_stack_ffffffffffffff24 = (uint)*(ushort *)(lVar11 + 0x1e);
          if (in_stack_ffffffffffffff24 == 0) {
            for (local_74 = 0; local_74 < iVar6; local_74 = local_74 + 1) {
              unaligned_load16((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
              fVar10 = (float)half_to_uint(0x15);
              *local_20 = fVar10;
              local_20 = (float *)((long)local_20 + (long)iVar7);
            }
          }
          else if (in_stack_ffffffffffffff24 == 1) {
            for (local_54 = 0; local_54 < iVar6; local_54 = local_54 + 1) {
              uVar9 = unaligned_load16((void *)CONCAT44(in_stack_ffffffffffffff24,
                                                        in_stack_ffffffffffffff20));
              *(uint16_t *)local_20 = uVar9;
              local_20 = (float *)((long)local_20 + (long)iVar7);
            }
          }
          else {
            if (in_stack_ffffffffffffff24 != 2) {
              return 3;
            }
            for (local_64 = 0; local_64 < iVar6; local_64 = local_64 + 1) {
              unaligned_load16((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
              fVar10 = half_to_float(0);
              *local_20 = fVar10;
              local_20 = (float *)((long)local_20 + (long)iVar7);
            }
          }
        }
        else {
          if (sVar1 != 2) {
            return 3;
          }
          in_stack_ffffffffffffff20 = (uint)*(ushort *)(lVar11 + 0x1e);
          if (in_stack_ffffffffffffff20 == 0) {
            for (local_a4 = 0; local_a4 < iVar6; local_a4 = local_a4 + 1) {
              unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
              fVar10 = (float)float_to_uint_int(0);
              *local_20 = fVar10;
              local_20 = (float *)((long)local_20 + (long)iVar7);
            }
          }
          else if (in_stack_ffffffffffffff20 == 1) {
            for (local_84 = 0; local_84 < iVar6; local_84 = local_84 + 1) {
              unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                              );
              uVar9 = float_to_half_int(0);
              *(uint16_t *)local_20 = uVar9;
              local_20 = (float *)((long)local_20 + (long)iVar7);
            }
          }
          else {
            if (in_stack_ffffffffffffff20 != 2) {
              return 3;
            }
            for (local_94 = 0; local_94 < iVar6; local_94 = local_94 + 1) {
              fVar10 = (float)unaligned_load32((void *)CONCAT44(in_stack_ffffffffffffff24,
                                                                in_stack_ffffffffffffff20));
              *local_20 = fVar10;
              local_20 = (float *)((long)local_20 + (long)iVar7);
            }
          }
        }
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc, uls;

    uls = decode->user_line_begin_skip;
    h = decode->chunk.height - decode->user_line_end_ignore;
    /*
     * user data starts at user line begin skip but because of
     * y_samples > 1 case, need to embed the run the loop and skip,
     * incrementing srcbuffer only when there'd be a line...
     */
    for (int y = 0; y < h; ++y)
    {
        int cury = (int)( (int64_t) y +
                          (int64_t) decode->chunk.start_y );

        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            w     = decc->width;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_pixel_stride;

            /* avoid a mod operation if we can */
            if (decc->y_samples > 1)
            {
                if ((cury % decc->y_samples) != 0) continue;
                if (y < uls || !cdata)
                {
                    srcbuffer += w * bpc;
                    continue;
                }

                cdata +=
                    ((uint64_t) ((y - uls) / decc->y_samples) *
                     (uint64_t) decc->user_line_stride);
            }
            else
            {
                if (y < uls || !cdata)
                {
                    srcbuffer += w * bpc;
                    continue;
                }

                cdata += ((uint64_t) (y - uls)) * ((uint64_t) decc->user_line_stride);
            }

            UNPACK_SAMPLES (w)
            srcbuffer += w * bpc;
        }
    }
    return EXR_ERR_SUCCESS;
}